

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

bool __thiscall QGraphicsView::viewportEvent(QGraphicsView *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  int iVar4;
  QGraphicsViewPrivate *pQVar5;
  QGraphicsScenePrivate *this_00;
  QWidget *pQVar6;
  QMetaObject *pQVar7;
  QGraphicsScene *pQVar8;
  QWidget *pQVar9;
  QObject *pQVar10;
  QGestureEvent *in_RSI;
  QGraphicsWidget *in_RDI;
  long in_FS_OFFSET;
  QGestureEvent *gestureEvent;
  QTouchEvent *touchEvent;
  QMetaObject *mo;
  QHelpEvent *toolTip;
  QGraphicsViewPrivate *d;
  QGraphicsSceneHelpEvent helpEvent;
  QGraphicsSceneEvent leaveEvent;
  QEvent windowDeactivate;
  QEvent windowActivate;
  QWidget *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  QAbstractScrollArea *in_stack_fffffffffffffee8;
  QGestureEvent *pQVar11;
  QWidget *in_stack_fffffffffffffef0;
  QPoint *in_stack_ffffffffffffff00;
  QGraphicsView *in_stack_ffffffffffffff08;
  QTouchEvent *in_stack_ffffffffffffff10;
  QGraphicsViewPrivate *in_stack_ffffffffffffff18;
  QWidget *in_stack_ffffffffffffff28;
  undefined1 uVar12;
  QGraphicsScenePrivate *in_stack_ffffffffffffff30;
  bool local_79;
  Connection local_78;
  QPoint local_70;
  QPointF local_68;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QGraphicsView *)0xa3c3ce);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3c3ea);
  if (!bVar1) {
    local_79 = QAbstractScrollArea::viewportEvent
                         (in_stack_fffffffffffffee8,
                          (QEvent *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    goto LAB_00a3ccd4;
  }
  TVar2 = QEvent::type(&in_RSI->super_QEvent);
  if (TVar2 == Enter) {
    pQVar10 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3c4e2)->
               super_QObject;
    QCoreApplication::sendEvent(pQVar10,&in_RSI->super_QEvent);
  }
  else if (TVar2 == Leave) {
    pQVar9 = QApplication::activePopupWidget();
    if (pQVar9 == (QWidget *)0x0) {
LAB_00a3c734:
      pQVar9 = QApplication::activeModalWidget();
      if (pQVar9 != (QWidget *)0x0) {
        pQVar9 = QApplication::activeModalWidget();
        pQVar6 = QWidget::window(in_stack_fffffffffffffef0);
        if (pQVar9 != pQVar6) goto LAB_00a3c785;
      }
      pQVar9 = QApplication::activeWindow();
      pQVar6 = QWidget::window(in_stack_fffffffffffffef0);
      if (pQVar9 != pQVar6) goto LAB_00a3c785;
    }
    else {
      in_stack_ffffffffffffff28 = QApplication::activePopupWidget();
      pQVar9 = QWidget::window(in_stack_fffffffffffffef0);
      if (in_stack_ffffffffffffff28 == pQVar9) goto LAB_00a3c734;
LAB_00a3c785:
      uVar12 = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3c799);
      QGraphicsScene::d_func((QGraphicsScene *)0xa3c7a1);
      bVar1 = QList<QGraphicsWidget_*>::isEmpty((QList<QGraphicsWidget_*> *)0xa3c7b0);
      if (!bVar1) {
        QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3c7c8);
        QGraphicsScene::d_func((QGraphicsScene *)0xa3c7d0);
        QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3c7e9);
        QGraphicsScene::d_func((QGraphicsScene *)0xa3c7f1);
        QList<QGraphicsWidget_*>::constFirst
                  ((QList<QGraphicsWidget_*> *)
                   CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
        QGraphicsScenePrivate::removePopup(in_stack_ffffffffffffff30,in_RDI,(bool)uVar12);
      }
    }
    *(uint *)&pQVar5->field_0x300 = *(uint *)&pQVar5->field_0x300 & 0xfffffff7;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneEvent::QGraphicsSceneEvent
              ((QGraphicsSceneEvent *)in_stack_fffffffffffffef0,
               (Type)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    QAbstractScrollArea::viewport
              ((QAbstractScrollArea *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0))
    ;
    QGraphicsSceneEvent::setWidget
              ((QGraphicsSceneEvent *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    pQVar10 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3c898)->
               super_QObject;
    QCoreApplication::sendEvent(pQVar10,(QEvent *)&local_40);
    bVar1 = QEvent::isAccepted((QEvent *)&local_40);
    (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
    QGraphicsSceneEvent::~QGraphicsSceneEvent
              ((QGraphicsSceneEvent *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0))
    ;
  }
  else if (TVar2 == Paint) {
    *(uint *)&pQVar5->field_0x300 = *(uint *)&pQVar5->field_0x300 & 0xffffefff;
    QPoint::QPoint((QPoint *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    pQVar5->dirtyScrollOffset = local_70;
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3ca74);
    if ((bVar1) && ((pQVar5->updateSceneSlotReimplementedChecked & 1U) == 0)) {
      pQVar5->updateSceneSlotReimplementedChecked = true;
      pQVar7 = (QMetaObject *)(*(code *)**(undefined8 **)&in_RDI->super_QGraphicsObject)();
      if (pQVar7 != &staticMetaObject) {
        iVar3 = QMetaObject::indexOfSlot((char *)pQVar7);
        iVar4 = QMetaObject::indexOfSlot((char *)&staticMetaObject);
        if (iVar3 != iVar4) {
          pQVar8 = ::QPointer::operator_cast_to_QGraphicsScene_
                             ((QPointer<QGraphicsScene> *)0xa3cb0d);
          QObject::connect((QObject *)&local_78,(char *)pQVar8,(QObject *)"2changed(QList<QRectF>)",
                           (char *)in_RDI,0xb46090);
          QMetaObject::Connection::~Connection(&local_78);
        }
      }
    }
  }
  else if (TVar2 == Show) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3c5e7);
    if ((bVar1) && (bVar1 = QWidget::isActiveWindow(in_stack_ffffffffffffff28), bVar1)) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_18,WindowActivate);
      pQVar10 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3c641)
                 ->super_QObject;
      QCoreApplication::sendEvent(pQVar10,(QEvent *)&local_18);
      QEvent::~QEvent((QEvent *)&local_18);
    }
  }
  else if (TVar2 == Hide) {
    bVar1 = QEvent::spontaneous(&in_RSI->super_QEvent);
    if (((!bVar1) &&
        (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3c68c), bVar1)) &&
       (bVar1 = QWidget::isActiveWindow(in_stack_ffffffffffffff28), bVar1)) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_28,WindowDeactivate);
      pQVar10 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3c6e6)
                 ->super_QObject;
      QCoreApplication::sendEvent(pQVar10,(QEvent *)&local_28);
      QEvent::~QEvent((QEvent *)&local_28);
    }
  }
  else if (TVar2 == WindowActivate) {
    pQVar10 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3c50b)->
               super_QObject;
    QCoreApplication::sendEvent(pQVar10,&in_RSI->super_QEvent);
  }
  else if (TVar2 == WindowDeactivate) {
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3c534);
    uVar12 = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
    QGraphicsScene::d_func((QGraphicsScene *)0xa3c53c);
    bVar1 = QList<QGraphicsWidget_*>::isEmpty((QList<QGraphicsWidget_*> *)0xa3c54b);
    if (!bVar1) {
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3c563);
      this_00 = QGraphicsScene::d_func((QGraphicsScene *)0xa3c56b);
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3c584);
      QGraphicsScene::d_func((QGraphicsScene *)0xa3c58c);
      QList<QGraphicsWidget_*>::constFirst
                ((QList<QGraphicsWidget_*> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      QGraphicsScenePrivate::removePopup(this_00,in_RDI,(bool)uVar12);
    }
    pQVar10 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3c5be)->
               super_QObject;
    QCoreApplication::sendEvent(pQVar10,&in_RSI->super_QEvent);
  }
  else {
    if (TVar2 == ToolTip) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneHelpEvent::QGraphicsSceneHelpEvent
                ((QGraphicsSceneHelpEvent *)in_stack_fffffffffffffef0,
                 (Type)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      QAbstractScrollArea::viewport
                ((QAbstractScrollArea *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      QGraphicsSceneEvent::setWidget
                ((QGraphicsSceneEvent *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
      QHelpEvent::globalPos((QHelpEvent *)in_RSI);
      QGraphicsSceneHelpEvent::setScreenPos
                ((QGraphicsSceneHelpEvent *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 (QPoint *)in_stack_fffffffffffffed8);
      QHelpEvent::pos((QHelpEvent *)in_RSI);
      local_68 = mapToScene(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      QGraphicsSceneHelpEvent::setScenePos
                ((QGraphicsSceneHelpEvent *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 (QPointF *)in_stack_fffffffffffffed8);
      pQVar10 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3c9c5)
                 ->super_QObject;
      QCoreApplication::sendEvent(pQVar10,(QEvent *)&local_58);
      bVar1 = QEvent::isAccepted((QEvent *)&local_58);
      (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
      local_79 = true;
      QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)0xa3ca1a);
      goto LAB_00a3ccd4;
    }
    if (TVar2 - TouchBegin < 3) {
      bVar1 = QWidget::isEnabled((QWidget *)0xa3cb55);
      if (bVar1) {
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3cb7a);
        if ((bVar1) && ((*(uint *)&pQVar5->field_0x300 & 1) != 0)) {
          pQVar11 = in_RSI;
          pQVar9 = QAbstractScrollArea::viewport
                             ((QAbstractScrollArea *)
                              CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
          QMutableTouchEvent::setTarget((QTouchEvent *)pQVar11,&pQVar9->super_QObject);
          QGraphicsViewPrivate::translateTouchEvent
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          pQVar10 = &::QPointer::operator_cast_to_QGraphicsScene_
                               ((QPointer<QGraphicsScene> *)0xa3cbea)->super_QObject;
          QCoreApplication::sendEvent(pQVar10,&in_RSI->super_QEvent);
        }
        else {
          QEvent::ignore(&in_RSI->super_QEvent);
        }
        local_79 = true;
      }
      else {
        local_79 = false;
      }
      goto LAB_00a3ccd4;
    }
    if ((TVar2 == Gesture) || (TVar2 == GestureOverride)) {
      bVar1 = QWidget::isEnabled((QWidget *)0xa3cc1d);
      if (bVar1) {
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3cc42);
        if ((bVar1) && ((*(uint *)&pQVar5->field_0x300 & 1) != 0)) {
          pQVar11 = in_RSI;
          pQVar9 = QAbstractScrollArea::viewport
                             ((QAbstractScrollArea *)
                              CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
          QGestureEvent::setWidget(pQVar11,pQVar9);
          pQVar10 = &::QPointer::operator_cast_to_QGraphicsScene_
                               ((QPointer<QGraphicsScene> *)0xa3cca0)->super_QObject;
          QCoreApplication::sendEvent(pQVar10,&in_RSI->super_QEvent);
        }
        local_79 = true;
      }
      else {
        local_79 = false;
      }
      goto LAB_00a3ccd4;
    }
  }
  local_79 = QAbstractScrollArea::viewportEvent
                       (in_stack_fffffffffffffee8,
                        (QEvent *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
LAB_00a3ccd4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_79;
}

Assistant:

bool QGraphicsView::viewportEvent(QEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene)
        return QAbstractScrollArea::viewportEvent(event);

    switch (event->type()) {
    case QEvent::Enter:
        QCoreApplication::sendEvent(d->scene, event);
        break;
    case QEvent::WindowActivate:
        QCoreApplication::sendEvent(d->scene, event);
        break;
    case QEvent::WindowDeactivate:
        // ### This is a temporary fix for until we get proper mouse
        // grab events. mouseGrabberItem should be set to 0 if we lose
        // the mouse grab.
        // Remove all popups when the scene loses focus.
        if (!d->scene->d_func()->popupWidgets.isEmpty())
            d->scene->d_func()->removePopup(d->scene->d_func()->popupWidgets.constFirst());
        QCoreApplication::sendEvent(d->scene, event);
        break;
    case QEvent::Show:
        if (d->scene && isActiveWindow()) {
            QEvent windowActivate(QEvent::WindowActivate);
            QCoreApplication::sendEvent(d->scene, &windowActivate);
        }
        break;
    case QEvent::Hide:
        // spontaneous event will generate a WindowDeactivate.
        if (!event->spontaneous() && d->scene && isActiveWindow()) {
            QEvent windowDeactivate(QEvent::WindowDeactivate);
            QCoreApplication::sendEvent(d->scene, &windowDeactivate);
        }
        break;
    case QEvent::Leave: {
        // ### This is a temporary fix for until we get proper mouse grab
        // events. activeMouseGrabberItem should be set to 0 if we lose the
        // mouse grab.
        if ((QApplication::activePopupWidget() && QApplication::activePopupWidget() != window())
            || (QApplication::activeModalWidget() && QApplication::activeModalWidget() != window())
            || (QApplication::activeWindow() != window())) {
            if (!d->scene->d_func()->popupWidgets.isEmpty())
                d->scene->d_func()->removePopup(d->scene->d_func()->popupWidgets.constFirst());
        }
        d->useLastMouseEvent = false;
        QGraphicsSceneEvent leaveEvent(QEvent::GraphicsSceneLeave);
        leaveEvent.setWidget(viewport());
        QCoreApplication::sendEvent(d->scene, &leaveEvent);
        event->setAccepted(leaveEvent.isAccepted());
        break;
    }
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip: {
        QHelpEvent *toolTip = static_cast<QHelpEvent *>(event);
        QGraphicsSceneHelpEvent helpEvent(QEvent::GraphicsSceneHelp);
        helpEvent.setWidget(viewport());
        helpEvent.setScreenPos(toolTip->globalPos());
        helpEvent.setScenePos(mapToScene(toolTip->pos()));
        QCoreApplication::sendEvent(d->scene, &helpEvent);
        toolTip->setAccepted(helpEvent.isAccepted());
        return true;
    }
#endif
    case QEvent::Paint:
        // Reset full update
        d->fullUpdatePending = false;
        d->dirtyScrollOffset = QPoint();
        if (d->scene) {
            // Check if this view reimplements the updateScene slot; if it
            // does, we can't do direct update delivery and have to fall back
            // to connecting the changed signal.
            if (!d->updateSceneSlotReimplementedChecked) {
                d->updateSceneSlotReimplementedChecked = true;
                const QMetaObject *mo = metaObject();
                if (mo != &QGraphicsView::staticMetaObject) {
                    if (mo->indexOfSlot("updateScene(QList<QRectF>)")
                        != QGraphicsView::staticMetaObject.indexOfSlot("updateScene(QList<QRectF>)")) {
                        connect(d->scene, SIGNAL(changed(QList<QRectF>)),
                                this, SLOT(updateScene(QList<QRectF>)));
                    }
                }
            }
        }
        break;
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
    {
        if (!isEnabled())
            return false;

        if (d->scene && d->sceneInteractionAllowed) {
            // Convert and deliver the touch event to the scene.
            QTouchEvent *touchEvent = static_cast<QTouchEvent *>(event);
            QMutableTouchEvent::setTarget(touchEvent, viewport());
            QGraphicsViewPrivate::translateTouchEvent(d, touchEvent);
            QCoreApplication::sendEvent(d->scene, touchEvent);
        } else {
            event->ignore();
        }

        return true;
    }
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
    case QEvent::GestureOverride:
    {
        if (!isEnabled())
            return false;

        if (d->scene && d->sceneInteractionAllowed) {
            QGestureEvent *gestureEvent = static_cast<QGestureEvent *>(event);
            gestureEvent->setWidget(viewport());
            QCoreApplication::sendEvent(d->scene, gestureEvent);
        }
        return true;
    }
#endif // QT_NO_GESTURES
    default:
        break;
    }

    return QAbstractScrollArea::viewportEvent(event);
}